

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O1

void __thiscall
MxxColl_ScattervUnknownSize_Test::~MxxColl_ScattervUnknownSize_Test
          (MxxColl_ScattervUnknownSize_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(MxxColl, ScattervUnknownSize) {
    mxx::comm c;
    std::vector<int> vec;
    std::vector<size_t> sizes;

    // scatter from last process
    if (c.rank() == c.size()-1) {
        sizes.resize(c.size());
        for (int i = 0; i < c.size(); ++i) {
            size_t size = 5*(c.size()-i)-3;
            sizes[i] = size;
            for (size_t j = 0; j < size; ++j) {
                vec.push_back(-2340*(int)j + 444*i);
            }
        }
    }

    std::vector<int> result;
    if (c.rank() == c.size()-1) {
        result = mxx::scatterv(vec, sizes, c.size()-1, c);
    } else {
        result = mxx::scatterv_recv<int>(c.size()-1);
    }

    ASSERT_EQ(5*(c.size()-c.rank())-3, (int)result.size());
    for (int j = 0; j < (int)result.size(); ++j) {
        ASSERT_EQ(-2340*j+444*c.rank(), result[j]);
    }
}